

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_pthreads.c
# Opt level: O2

LOCK_RESULT Unlock(LOCK_HANDLE handle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (handle == (LOCK_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return LOCK_ERROR;
    }
    pcVar3 = "Invalid argument; handle is NULL.";
    iVar1 = 0x41;
  }
  else {
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)handle);
    if (iVar1 == 0) {
      return LOCK_OK;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return LOCK_ERROR;
    }
    pcVar3 = "pthread_mutex_unlock failed (%d).";
    iVar1 = 0x4f;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/lock_pthreads.c"
            ,"Unlock",iVar1,1,pcVar3);
  return LOCK_ERROR;
}

Assistant:

LOCK_RESULT Unlock(LOCK_HANDLE handle)
{
    LOCK_RESULT result;
    if (handle == NULL)
    {
        /* Codes_SRS_LOCK_10_007: [Unlock on NULL handle passed returns LOCK_ERROR] */
        LogError("Invalid argument; handle is NULL.");
        result = LOCK_ERROR;
    }
    else
    {
        int return_code = pthread_mutex_unlock((pthread_mutex_t*)handle);
        if (return_code == 0)
        {
            /* Codes_SRS_LOCK_10_009: [Unlock on success shall return LOCK_OK] */
            result = LOCK_OK;
        }
        else
        {
            /* Codes_SRS_LOCK_10_010: [Unlock on error shall return LOCK_ERROR] */
            LogError("pthread_mutex_unlock failed (%d).", return_code);
            result = LOCK_ERROR;
        }
    }

    return result;
}